

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O2

uint xmlDictHashName(uint seed,xmlChar *data,size_t maxLen,size_t *plen)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  size_t sVar4;
  
  uVar1 = seed ^ 0x3b00;
  uVar3 = seed << 0xf | seed >> 0x11;
  for (sVar4 = 0; (sVar2 = maxLen, maxLen != sVar4 && (sVar2 = sVar4, data[sVar4] != 0));
      sVar4 = sVar4 + 1) {
    uVar1 = (uVar1 + data[sVar4]) * 9;
    uVar3 = ((uVar3 + uVar1) * 0x80 | uVar3 + uVar1 >> 0x19) * 5;
  }
  uVar1 = (uVar3 << 0xe | uVar3 >> 0x12) + (uVar1 ^ uVar3);
  uVar3 = (uVar1 * 0x4000000 | uVar1 >> 6) + (uVar3 ^ uVar1);
  uVar1 = (uVar3 * 0x20 | uVar3 >> 0x1b) + (uVar1 ^ uVar3);
  *plen = sVar2;
  return (uVar1 * 0x1000000 | uVar1 >> 8) + (uVar3 ^ uVar1) | 0x80000000;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static unsigned
xmlDictHashName(unsigned seed, const xmlChar* data, size_t maxLen,
                size_t *plen) {
    unsigned h1, h2;
    size_t i;

    HASH_INIT(h1, h2, seed);

    for (i = 0; i < maxLen && data[i]; i++) {
        HASH_UPDATE(h1, h2, data[i]);
    }

    HASH_FINISH(h1, h2);

    *plen = i;
    return(h2 | MAX_HASH_SIZE);
}